

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CursorFirstSorted(Fts5FullTable *pTab,Fts5Cursor *pCsr,int bDesc)

{
  Fts5Config *pConfig_00;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  sqlite3_uint64 n;
  Fts5Sorter *ppStmt;
  char *pcVar4;
  char *local_b0;
  char *zRankArgs;
  char *zRank;
  int rc;
  sqlite3_int64 nByte;
  int nPhrase;
  Fts5Sorter *pSorter;
  Fts5Config *pConfig;
  int bDesc_local;
  Fts5Cursor *pCsr_local;
  Fts5FullTable *pTab_local;
  
  pConfig_00 = (pTab->p).pConfig;
  pcVar1 = pCsr->zRank;
  local_b0 = pCsr->zRankArgs;
  iVar3 = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  n = (long)(iVar3 + -1) * 4 + 0x20;
  ppStmt = (Fts5Sorter *)sqlite3_malloc64(n);
  if (ppStmt == (Fts5Sorter *)0x0) {
    pTab_local._4_4_ = 7;
  }
  else {
    memset(ppStmt,0,n);
    ppStmt->nIdx = iVar3;
    pcVar4 = "";
    if (local_b0 == (char *)0x0) {
      local_b0 = "";
    }
    else {
      pcVar4 = ", ";
    }
    pcVar2 = "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC";
    if (bDesc != 0) {
      pcVar2 = "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC";
    }
    zRank._4_4_ = fts5PrepareStatement
                            ((sqlite3_stmt **)ppStmt,pConfig_00,
                             "SELECT rowid, rank FROM %Q.%Q ORDER BY %s(%s%s%s) %s",pConfig_00->zDb,
                             pConfig_00->zName,pcVar1,pConfig_00->zName,pcVar4,local_b0,
                             pcVar2 + 0x40);
    pCsr->pSorter = ppStmt;
    if (zRank._4_4_ == 0) {
      pTab->pSortCsr = pCsr;
      zRank._4_4_ = fts5SorterNext(pCsr);
      pTab->pSortCsr = (Fts5Cursor *)0x0;
    }
    if (zRank._4_4_ != 0) {
      sqlite3_finalize(ppStmt->pStmt);
      sqlite3_free(ppStmt);
      pCsr->pSorter = (Fts5Sorter *)0x0;
    }
    pTab_local._4_4_ = zRank._4_4_;
  }
  return pTab_local._4_4_;
}

Assistant:

static int fts5CursorFirstSorted(
  Fts5FullTable *pTab, 
  Fts5Cursor *pCsr, 
  int bDesc
){
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Sorter *pSorter;
  int nPhrase;
  sqlite3_int64 nByte;
  int rc;
  const char *zRank = pCsr->zRank;
  const char *zRankArgs = pCsr->zRankArgs;
  
  nPhrase = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  nByte = sizeof(Fts5Sorter) + sizeof(int) * (nPhrase-1);
  pSorter = (Fts5Sorter*)sqlite3_malloc64(nByte);
  if( pSorter==0 ) return SQLITE_NOMEM;
  memset(pSorter, 0, (size_t)nByte);
  pSorter->nIdx = nPhrase;

  /* TODO: It would be better to have some system for reusing statement
  ** handles here, rather than preparing a new one for each query. But that
  ** is not possible as SQLite reference counts the virtual table objects.
  ** And since the statement required here reads from this very virtual 
  ** table, saving it creates a circular reference.
  **
  ** If SQLite a built-in statement cache, this wouldn't be a problem. */
  rc = fts5PrepareStatement(&pSorter->pStmt, pConfig,
      "SELECT rowid, rank FROM %Q.%Q ORDER BY %s(%s%s%s) %s",
      pConfig->zDb, pConfig->zName, zRank, pConfig->zName,
      (zRankArgs ? ", " : ""),
      (zRankArgs ? zRankArgs : ""),
      bDesc ? "DESC" : "ASC"
  );

  pCsr->pSorter = pSorter;
  if( rc==SQLITE_OK ){
    assert( pTab->pSortCsr==0 );
    pTab->pSortCsr = pCsr;
    rc = fts5SorterNext(pCsr);
    pTab->pSortCsr = 0;
  }

  if( rc!=SQLITE_OK ){
    sqlite3_finalize(pSorter->pStmt);
    sqlite3_free(pSorter);
    pCsr->pSorter = 0;
  }

  return rc;
}